

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_buffer.c
# Opt level: O2

void test_cio_write_buffer_split_and_append_empty_list(void)

{
  undefined8 expected;
  cio_write_buffer wb2;
  cio_write_buffer wb1;
  cio_write_buffer wbh_to_append;
  cio_write_buffer wbh_to_split;
  
  wbh_to_split.data.head.q_len = 0;
  wbh_to_split.data.element.length = 0;
  wbh_to_append.data.head.q_len = 0;
  wbh_to_append.data.element.length = 0;
  wb1.data.head.q_len = (size_t)anon_var_dwarf_42a;
  wb1.data.element.length = 6;
  wbh_to_append.next = &wbh_to_append;
  wbh_to_append.prev = &wbh_to_append;
  wbh_to_split.next = &wbh_to_split;
  wbh_to_split.prev = &wbh_to_split;
  cio_write_buffer_queue_tail(&wbh_to_append,&wb1);
  wb2.data.head.q_len = (size_t)anon_var_dwarf_441;
  wb2.data.element.length = 6;
  cio_write_buffer_queue_tail(&wbh_to_append,&wb2);
  expected = wbh_to_append.data.element.length;
  cio_write_buffer_split_and_append(&wbh_to_append,&wbh_to_split,&wbh_to_split);
  UnityAssertEqualNumber
            (0,wbh_to_split.data.head.q_len,"Number of elements in splitted list not correct!",0x17b
             ,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,wbh_to_split.data.element.length,"Total size of splitted list not correct!",0x17c,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (2,wbh_to_append.data.head.q_len,"Number of elements in appended list not correct!",
             0x17d,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (expected,wbh_to_append.data.element.length,"Total size of appended list not correct!",
             0x17e,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_cio_write_buffer_split_and_append_empty_list(void)
{
	struct cio_write_buffer wbh_to_split;
	cio_write_buffer_head_init(&wbh_to_split);

	struct cio_write_buffer wbh_to_append;
	cio_write_buffer_head_init(&wbh_to_append);

	struct cio_write_buffer wb1;
	cio_write_buffer_const_element_init(&wb1, "HELLO", sizeof("HELLO"));
	cio_write_buffer_queue_tail(&wbh_to_append, &wb1);
	struct cio_write_buffer wb2;
	cio_write_buffer_const_element_init(&wb2, "World", sizeof("World"));
	cio_write_buffer_queue_tail(&wbh_to_append, &wb2);
	size_t size_before_append = cio_write_buffer_get_total_size(&wbh_to_append);

	struct cio_write_buffer *e = &wbh_to_split;

	cio_write_buffer_split_and_append(&wbh_to_append, &wbh_to_split, e);
	TEST_ASSERT_EQUAL_MESSAGE(0, cio_write_buffer_get_num_buffer_elements(&wbh_to_split), "Number of elements in splitted list not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(0, cio_write_buffer_get_total_size(&wbh_to_split), "Total size of splitted list not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(2, cio_write_buffer_get_num_buffer_elements(&wbh_to_append), "Number of elements in appended list not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(size_before_append, cio_write_buffer_get_total_size(&wbh_to_append), "Total size of appended list not correct!");
}